

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

int google::protobuf::Base64EscapeInternal
              (uchar *src,int szsrc,char *dest,int szdest,char *base64,bool do_padding)

{
  byte bVar1;
  uchar *puVar2;
  uint16 uVar3;
  int iVar4;
  uint32 uVar5;
  uint uVar6;
  LogMessage *pLVar7;
  LogFinisher local_b5 [13];
  LogMessage local_a8;
  uint32 in_3;
  uint32 in_2;
  uint32 in_1;
  uint32 in;
  uchar *limit_src;
  char *limit_dest;
  uchar *cur_src;
  char *cur_dest;
  char *pcStack_38;
  bool do_padding_local;
  char *base64_local;
  char *pcStack_28;
  int szdest_local;
  char *dest_local;
  uchar *puStack_18;
  int szsrc_local;
  uchar *src_local;
  
  if (szsrc < 1) {
    src_local._4_4_ = 0;
  }
  else {
    iVar4 = szsrc * 4;
    if (iVar4 == szdest * 3 || SBORROW4(iVar4,szdest * 3) != iVar4 + szdest * -3 < 0) {
      limit_src = (uchar *)(dest + szdest);
      _in_1 = src + szsrc;
      cur_src = (uchar *)dest;
      cur_dest._7_1_ = do_padding;
      pcStack_38 = base64;
      base64_local._4_4_ = szdest;
      pcStack_28 = dest;
      dest_local._4_4_ = szsrc;
      puStack_18 = src;
      for (limit_dest = (char *)src; limit_dest < _in_1 + -3; limit_dest = limit_dest + 3) {
        uVar5 = BigEndian::Load32(limit_dest);
        uVar6 = uVar5 >> 8;
        *cur_src = pcStack_38[uVar5 >> 0x1a];
        cur_src[1] = pcStack_38[(uVar6 & 0x3ffff) >> 0xc];
        cur_src[2] = pcStack_38[(uVar6 & 0xfff) >> 6];
        in_2 = uVar6 & 0x3f;
        cur_src[3] = pcStack_38[in_2];
        cur_src = cur_src + 4;
      }
      base64_local._4_4_ = (int)limit_src - (int)cur_src;
      dest_local._4_4_ = in_1 - (int)limit_dest;
      switch(dest_local._4_4_) {
      case 0:
        puVar2 = cur_src;
        break;
      case 1:
        if (base64_local._4_4_ + -2 < 0) {
          return 0;
        }
        bVar1 = *limit_dest;
        *cur_src = pcStack_38[bVar1 >> 2];
        cur_src[1] = pcStack_38[(bVar1 & 3) << 4];
        puVar2 = cur_src + 2;
        if ((cur_dest._7_1_ & 1) != 0) {
          if (base64_local._4_4_ + -4 < 0) {
            return 0;
          }
          cur_src[2] = '=';
          cur_src[3] = '=';
          puVar2 = cur_src + 4;
        }
        break;
      case 2:
        base64_local._4_4_ = base64_local._4_4_ + -3;
        if (base64_local._4_4_ < 0) {
          return 0;
        }
        uVar3 = BigEndian::Load16(limit_dest);
        *cur_src = pcStack_38[uVar3 >> 10];
        cur_src[1] = pcStack_38[(uVar3 & 0x3ff) >> 4];
        cur_src[2] = pcStack_38[(uVar3 & 0xf) << 2];
        puVar2 = cur_src + 3;
        if ((cur_dest._7_1_ & 1) != 0) {
          if (base64_local._4_4_ + -1 < 0) {
            return 0;
          }
          cur_src[3] = '=';
          puVar2 = cur_src + 4;
        }
        break;
      case 3:
        base64_local._4_4_ = base64_local._4_4_ + -4;
        if (base64_local._4_4_ < 0) {
          return 0;
        }
        bVar1 = *limit_dest;
        uVar3 = BigEndian::Load16(limit_dest + 1);
        uVar6 = (uint)bVar1 * 0x10000 + (uint)uVar3;
        *cur_src = pcStack_38[uVar6 >> 0x12];
        cur_src[1] = pcStack_38[(uVar6 & 0x3ffff) >> 0xc];
        cur_src[2] = pcStack_38[(uVar6 & 0xfff) >> 6];
        cur_src[3] = pcStack_38[uVar6 & 0x3f];
        puVar2 = cur_src + 4;
        break;
      default:
        internal::LogMessage::LogMessage
                  (&local_a8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
                   ,0x88b);
        pLVar7 = internal::LogMessage::operator<<(&local_a8,"Logic problem? szsrc = ");
        pLVar7 = internal::LogMessage::operator<<(pLVar7,dest_local._4_4_);
        internal::LogFinisher::operator=(local_b5,pLVar7);
        internal::LogMessage::~LogMessage(&local_a8);
        puVar2 = cur_src;
      }
      cur_src = puVar2;
      src_local._4_4_ = (int)cur_src - (int)pcStack_28;
    }
    else {
      src_local._4_4_ = 0;
    }
  }
  return src_local._4_4_;
}

Assistant:

int Base64EscapeInternal(const unsigned char *src, int szsrc,
                         char *dest, int szdest, const char *base64,
                         bool do_padding) {
  static const char kPad64 = '=';

  if (szsrc <= 0) return 0;

  if (szsrc * 4 > szdest * 3) return 0;

  char *cur_dest = dest;
  const unsigned char *cur_src = src;

  char *limit_dest = dest + szdest;
  const unsigned char *limit_src = src + szsrc;

  // Three bytes of data encodes to four characters of cyphertext.
  // So we can pump through three-byte chunks atomically.
  while (cur_src < limit_src - 3) {  // keep going as long as we have >= 32 bits
    uint32 in = BigEndian::Load32(cur_src) >> 8;

    cur_dest[0] = base64[in >> 18];
    in &= 0x3FFFF;
    cur_dest[1] = base64[in >> 12];
    in &= 0xFFF;
    cur_dest[2] = base64[in >> 6];
    in &= 0x3F;
    cur_dest[3] = base64[in];

    cur_dest += 4;
    cur_src += 3;
  }
  // To save time, we didn't update szdest or szsrc in the loop.  So do it now.
  szdest = limit_dest - cur_dest;
  szsrc = limit_src - cur_src;

  /* now deal with the tail (<=3 bytes) */
  switch (szsrc) {
    case 0:
      // Nothing left; nothing more to do.
      break;
    case 1: {
      // One byte left: this encodes to two characters, and (optionally)
      // two pad characters to round out the four-character cypherblock.
      if ((szdest -= 2) < 0) return 0;
      uint32 in = cur_src[0];
      cur_dest[0] = base64[in >> 2];
      in &= 0x3;
      cur_dest[1] = base64[in << 4];
      cur_dest += 2;
      if (do_padding) {
        if ((szdest -= 2) < 0) return 0;
        cur_dest[0] = kPad64;
        cur_dest[1] = kPad64;
        cur_dest += 2;
      }
      break;
    }
    case 2: {
      // Two bytes left: this encodes to three characters, and (optionally)
      // one pad character to round out the four-character cypherblock.
      if ((szdest -= 3) < 0) return 0;
      uint32 in = BigEndian::Load16(cur_src);
      cur_dest[0] = base64[in >> 10];
      in &= 0x3FF;
      cur_dest[1] = base64[in >> 4];
      in &= 0x00F;
      cur_dest[2] = base64[in << 2];
      cur_dest += 3;
      if (do_padding) {
        if ((szdest -= 1) < 0) return 0;
        cur_dest[0] = kPad64;
        cur_dest += 1;
      }
      break;
    }
    case 3: {
      // Three bytes left: same as in the big loop above.  We can't do this in
      // the loop because the loop above always reads 4 bytes, and the fourth
      // byte is past the end of the input.
      if ((szdest -= 4) < 0) return 0;
      uint32 in = (cur_src[0] << 16) + BigEndian::Load16(cur_src + 1);
      cur_dest[0] = base64[in >> 18];
      in &= 0x3FFFF;
      cur_dest[1] = base64[in >> 12];
      in &= 0xFFF;
      cur_dest[2] = base64[in >> 6];
      in &= 0x3F;
      cur_dest[3] = base64[in];
      cur_dest += 4;
      break;
    }
    default:
      // Should not be reached: blocks of 4 bytes are handled
      // in the while loop before this switch statement.
      GOOGLE_LOG(FATAL) << "Logic problem? szsrc = " << szsrc;
      break;
  }
  return (cur_dest - dest);
}